

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

Fiber * fiber_init(Fiber *fbr,void *stack,size_t stack_size,FiberCleanupFunc cleanup,void *arg)

{
  void *arg_local;
  FiberCleanupFunc cleanup_local;
  size_t stack_size_local;
  void *stack_local;
  Fiber *fbr_local;
  
  fbr->stack = stack;
  fbr->stack_size = stack_size;
  fbr->alloc_stack = (void *)0x0;
  fbr->state = 0;
  fiber_init_(fbr,cleanup,arg);
  return fbr;
}

Assistant:

Fiber *
fiber_init(Fiber *fbr,
           void *stack,
           size_t stack_size,
           FiberCleanupFunc cleanup,
           void *arg)
{
    NULL_CHECK(fbr, "Fiber cannot be NULL");
    fbr->stack = stack;
    fbr->stack_size = stack_size;
    fbr->alloc_stack = NULL;
    fbr->state = 0;
    fiber_init_(fbr, cleanup, arg);
    return fbr;
}